

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>_>::
     load(BinaryBuffer *bb,Vector *v)

{
  vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *in_RSI;
  Point<float,_2U> *in_RDI;
  vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *unaff_retaddr;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffc8;
  BinaryBuffer *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *this;
  
  load<unsigned_long>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this = in_RSI;
  Point<float,_2U>::Point((Point<float,_2U> *)in_RSI);
  Catch::clara::std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>::resize
            (unaff_retaddr,(size_type)in_RDI,(value_type *)this);
  if (local_18 != 0) {
    Catch::clara::std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>::
    operator[](this,0);
    load<diy::Point<float,2u>>((BinaryBuffer *)in_RSI,in_RDI,0x19d7ff);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }